

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

TimeProcessingResult __thiscall
helics::TimeCoordinator::processTimeBlockMessage(TimeCoordinator *this,ActionMessage *cmd)

{
  bool bVar1;
  action_t aVar2;
  ActionMessage *in_RSI;
  long in_RDI;
  TimeCoordinator *unaff_retaddr;
  Time in_stack_00000008;
  Time ltime;
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
  *in_stack_ffffffffffffffc0;
  TimeRepresentation<count_time<9,_long>_> local_20 [3];
  int32_t in_stack_fffffffffffffffc;
  
  local_20[0].internalTimeCode = 0x7fffffffffffffff;
  aVar2 = ActionMessage::action(in_RSI);
  switch(aVar2) {
  case cmd_time_block:
  case cmd_time_barrier:
    local_20[0].internalTimeCode =
         (baseType)updateTimeBlocks(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_00000008);
    break;
  case cmd_time_unblock:
  case cmd_time_barrier_clear:
    bVar1 = std::
            vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
            ::empty(in_stack_ffffffffffffffc0);
    if (!bVar1) {
      TimeRepresentation<count_time<9,_long>_>::maxVal();
      local_20[0].internalTimeCode =
           (baseType)updateTimeBlocks(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_00000008);
    }
    break;
  default:
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                    (local_20,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x180));
  if (bVar1) {
    *(baseType *)(in_RDI + 0x180) = local_20[0].internalTimeCode;
  }
  else {
    *(baseType *)(in_RDI + 0x180) = local_20[0].internalTimeCode;
  }
  return bVar1;
}

Assistant:

TimeProcessingResult TimeCoordinator::processTimeBlockMessage(const ActionMessage& cmd)
{
    Time ltime = Time::maxVal();
    switch (cmd.action()) {
        case CMD_TIME_BLOCK:
        case CMD_TIME_BARRIER:
            ltime = updateTimeBlocks(cmd.messageID, cmd.actionTime);
            break;
        case CMD_TIME_UNBLOCK:
        case CMD_TIME_BARRIER_CLEAR:
            if (!timeBlocks.empty()) {
                ltime = updateTimeBlocks(cmd.messageID, Time::maxVal());
            }
            break;
        default:
            break;
    }
    if (ltime > time_block) {
        time_block = ltime;
        return TimeProcessingResult::PROCESSED;
    }
    time_block = ltime;
    return TimeProcessingResult::NOT_PROCESSED;
}